

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_write(drwav *pWav,drwav_uint64 samplesToWrite,void *pData)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  
  if (pData == (void *)0x0 || (samplesToWrite == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  sVar2 = pWav->bitsPerSample * samplesToWrite >> 3;
  lVar3 = 0;
  do {
    if (sVar2 == 0) break;
    if (pData == (void *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = (*pWav->onWrite)(pWav->pUserData,pData,sVar2);
      pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar1;
    }
    sVar2 = sVar2 - sVar1;
    lVar3 = lVar3 + sVar1;
    pData = (void *)((long)pData + sVar1);
  } while (sVar1 != 0);
  return (ulong)(lVar3 << 3) / (ulong)pWav->bitsPerSample;
}

Assistant:

drwav_uint64 drwav_write(drwav* pWav, drwav_uint64 samplesToWrite, const void* pData)
{
    if (pWav == NULL || samplesToWrite == 0 || pData == NULL) {
        return 0;
    }

    drwav_uint64 bytesToWrite = ((samplesToWrite * pWav->bitsPerSample) / 8);
    if (bytesToWrite > DRWAV_SIZE_MAX) {
        return 0;
    }

    drwav_uint64 bytesWritten = 0;
    const drwav_uint8* pRunningData = (const drwav_uint8*)pData;
    while (bytesToWrite > 0) {
        drwav_uint64 bytesToWriteThisIteration = bytesToWrite;
        if (bytesToWriteThisIteration > DRWAV_SIZE_MAX) {
            bytesToWriteThisIteration = DRWAV_SIZE_MAX;
        }

        size_t bytesJustWritten = drwav_write_raw(pWav, (size_t)bytesToWriteThisIteration, pRunningData);
        if (bytesJustWritten == 0) {
            break;
        }

        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }

    return (bytesWritten * 8) / pWav->bitsPerSample;
}